

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

void __thiscall trompeloeil::trace_agent::trace_exception(trace_agent *this)

{
  long *plVar1;
  char *pcVar2;
  ostream *poVar3;
  ostringstream *poVar4;
  undefined1 auVar5 [12];
  char local_19;
  
  if (this->t != (tracer *)0x0) {
    auVar5 = __cxa_rethrow();
    plVar1 = (long *)__cxa_begin_catch(auVar5._0_8_);
    poVar4 = &this->os;
    if (auVar5._8_4_ != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar4,"threw unknown exception\n",0x18);
      __cxa_end_catch();
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"threw exception: what() = ",0x1a);
    pcVar2 = (char *)(**(code **)(*plVar1 + 0x10))(plVar1);
    poVar3 = std::operator<<((ostream *)poVar4,pcVar2);
    local_19 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
    __cxa_end_catch();
  }
  return;
}

Assistant:

void
    trace_exception()
    {
      if (t)
      {
        try {
          throw;
        }
        catch (std::exception& e)
        {
          os << "threw exception: what() = " << e.what() << '\n';
        }
        catch (...)
        {
          os << "threw unknown exception\n";
        }
      }
    }